

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTimeConstraint.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_4ff82::TestTimeConstraintFailsWithSlowTest::RunImpl
          (TestTimeConstraintFailsWithSlowTest *this)

{
  TestResults *results;
  int iVar1;
  TestResults **ppTVar2;
  TestDetails **ppTVar3;
  ScopedCurrentTest scopedResult;
  TimeConstraint t;
  TestResults result;
  ScopedCurrentTest local_70;
  TestDetails local_60;
  TestDetails local_40;
  TestResults local_20;
  
  UnitTest::TestResults::TestResults(&local_20,(TestReporter *)0x0);
  ppTVar2 = UnitTest::CurrentTest::Results();
  local_70.m_oldTestResults = *ppTVar2;
  ppTVar3 = UnitTest::CurrentTest::Details();
  local_70.m_oldTestDetails = *ppTVar3;
  ppTVar2 = UnitTest::CurrentTest::Results();
  *ppTVar2 = &local_20;
  UnitTest::TestDetails::TestDetails(&local_40,"","","",0);
  UnitTest::TimeConstraint::TimeConstraint((TimeConstraint *)&local_60,10,&local_40);
  UnitTest::TimeHelpers::SleepMs(0x14);
  UnitTest::TimeConstraint::~TimeConstraint((TimeConstraint *)&local_60);
  ScopedCurrentTest::~ScopedCurrentTest(&local_70);
  ppTVar2 = UnitTest::CurrentTest::Results();
  results = *ppTVar2;
  local_40.suiteName._0_4_ = 1;
  iVar1 = UnitTest::TestResults::GetFailureCount(&local_20);
  local_70.m_oldTestResults = (TestResults *)CONCAT44(local_70.m_oldTestResults._4_4_,iVar1);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_60,*ppTVar3,0x1f);
  UnitTest::CheckEqual<int,int>(results,(int *)&local_40,(int *)&local_70,&local_60);
  return;
}

Assistant:

TEST(TimeConstraintFailsWithSlowTest)
{
    TestResults result;
    {
		ScopedCurrentTest scopedResult(result);
        TimeConstraint t(10, TestDetails("", "", "", 0));
        TimeHelpers::SleepMs(20);
    }
    CHECK_EQUAL(1, result.GetFailureCount());
}